

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffbfeof(fitsfile *fptr,int *status)

{
  FITSfile *pFVar1;
  long lVar2;
  long lVar3;
  
  pFVar1 = fptr->Fptr;
  lVar2 = pFVar1->filesize;
  lVar3 = 0;
  do {
    if (lVar2 <= pFVar1->bufrecnum[lVar3] * 0xb40) {
      pFVar1->bufrecnum[lVar3] = -1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x28);
  return *status;
}

Assistant:

int ffbfeof(fitsfile *fptr,        /* I - FITS file pointer           */
           int *status)           /* IO - error status               */
{
/*
  clear any buffers beyond the end of file
*/
    int ii;

    for (ii = 0; ii < NIOBUF; ii++)
    {
        if ( (LONGLONG) (fptr->Fptr)->bufrecnum[ii] * IOBUFLEN >= fptr->Fptr->filesize)
        {
            (fptr->Fptr)->bufrecnum[ii] = -1;  /* set contents of buffer as undefined */
        }
    }

    return(*status);
}